

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::push_back
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,
          uchar *value)

{
  size_t sVar1;
  size_t n;
  
  sVar1 = this->nAlloc;
  if (sVar1 == this->nStored) {
    n = 4;
    if (sVar1 != 0) {
      n = sVar1 * 2;
    }
    reserve(this,n);
  }
  this->ptr[this->nStored] = *value;
  this->nStored = this->nStored + 1;
  return;
}

Assistant:

void push_back(T &&value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, std::move(value));
        ++nStored;
    }